

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  vector_vec_type *this_00;
  tile_details *ptVar5;
  vec<2U,_float> *this_01;
  vec<2U,_float> *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_54;
  float dist;
  uint i;
  uint best_index;
  float best_dist;
  vec2F *v;
  uint a;
  uint tEnd;
  uint t;
  uint num_tasks;
  vector<crnlib::vec<2U,_float>_> *codebook;
  tree_clusterizer<crnlib::vec<2U,_float>_> *vq;
  void *pData_ptr_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  this_00 = tree_clusterizer<crnlib::vec<2U,_float>_>::get_codebook
                      ((tree_clusterizer<crnlib::vec<2U,_float>_> *)pData_ptr);
  uVar1 = task_pool::get_num_threads(this->m_pTask_pool);
  uVar2 = vector<crnlib::dxt_hc::tile_details>::size(&this->m_tiles);
  a = (uint)((uVar2 * data) / (ulong)(uVar1 + 1));
  uVar2 = vector<crnlib::dxt_hc::tile_details>::size(&this->m_tiles);
  do {
    if ((uint)(((ulong)uVar2 * (data + 1)) / (ulong)(uVar1 + 1)) <= a) {
      return;
    }
    ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,a);
    uVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&ptVar5->pixels);
    if (uVar3 != 0) {
      for (v._0_4_ = 0; (uint)v < this->m_num_alpha_blocks; v._0_4_ = (uint)v + 1) {
        ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,a);
        this_01 = ptVar5->alpha_endpoints + (uint)v;
        i = 0x7cf0bdc2;
        dist = 0.0;
        local_54 = 0.0;
        while( true ) {
          fVar4 = (float)vector<crnlib::vec<2U,_float>_>::size(this_00);
          if ((uint)fVar4 <= (uint)local_54) break;
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,(uint)local_54);
          fVar4 = vec<2U,_float>::operator[](pvVar6,0);
          fVar7 = vec<2U,_float>::operator[](this_01,0);
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,(uint)local_54);
          fVar8 = vec<2U,_float>::operator[](pvVar6,0);
          fVar9 = vec<2U,_float>::operator[](this_01,0);
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,(uint)local_54);
          fVar10 = vec<2U,_float>::operator[](pvVar6,1);
          fVar11 = vec<2U,_float>::operator[](this_01,1);
          pvVar6 = vector<crnlib::vec<2U,_float>_>::operator[](this_00,(uint)local_54);
          fVar12 = vec<2U,_float>::operator[](pvVar6,1);
          fVar13 = vec<2U,_float>::operator[](this_01,1);
          fVar7 = (fVar4 - fVar7) * (fVar8 - fVar9) + (fVar10 - fVar11) * (fVar12 - fVar13);
          fVar4 = dist;
          if (fVar7 < (float)i) {
            dist = local_54;
            fVar4 = dist;
            dist._0_2_ = SUB42(local_54,0);
            i = (uint)fVar7;
            if ((fVar7 == 0.0) && (!NAN(fVar7))) break;
          }
          dist = fVar4;
          local_54 = (float)((int)local_54 + 1);
        }
        ptVar5 = vector<crnlib::dxt_hc::tile_details>::operator[](&this->m_tiles,a);
        ptVar5->cluster_indices[(uint)v + 1] = dist._0_2_;
      }
    }
    a = a + 1;
  } while( true );
}

Assistant:

void dxt_hc::determine_alpha_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec2F>* vq = (tree_clusterizer<vec2F>*)pData_ptr;
  const crnlib::vector<vec2F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      for (uint a = 0; a < m_num_alpha_blocks; a++) {
        const vec2F& v = m_tiles[t].alpha_endpoints[a];
        float best_dist = math::cNearlyInfinite;
        uint best_index = 0;
        for (uint i = 0; i < codebook.size(); i++) {
          float dist = (codebook[i][0] - v[0]) * (codebook[i][0] - v[0]) + (codebook[i][1] - v[1]) * (codebook[i][1] - v[1]);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = i;
            if (best_dist == 0.0f)
              break;
          }
        }
        m_tiles[t].cluster_indices[cAlpha0 + a] = best_index;
      }
    }
  }
}